

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O2

void __thiscall OpenMD::Shake::constraintF(Shake *this)

{
  Molecule *pMVar1;
  pointer ppCVar2;
  RealType RVar3;
  ConstraintPair *consPair;
  MoleculeIterator mi;
  list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> constraints;
  ConstraintPair *local_58;
  MoleculeIterator local_50;
  _List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> local_48;
  
  if (this->doShake_ == true) {
    doConstraint(this,0x171752);
    RVar3 = Snapshot::getTime(this->currentSnapshot_);
    if (this->currConstraintTime_ <= RVar3) {
      local_50._M_node = (_Base_ptr)0x0;
      local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
      local_48._M_impl._M_node._M_size = 0;
      local_48._M_impl._M_node.super__List_node_base._M_prev =
           local_48._M_impl._M_node.super__List_node_base._M_next;
      pMVar1 = SimInfo::beginMolecule(this->info_,&local_50);
      while (pMVar1 != (Molecule *)0x0) {
        ppCVar2 = (pMVar1->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppCVar2 !=
            (pMVar1->constraintPairs_).
            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_001716ec;
        local_58 = (ConstraintPair *)0x0;
        while (local_58 != (ConstraintPair *)0x0) {
          std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::
          push_back((list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                    &local_48,&local_58);
          ppCVar2 = ppCVar2 + 1;
          local_58 = (ConstraintPair *)0x0;
          if (ppCVar2 !=
              (pMVar1->constraintPairs_).
              super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001716ec:
            local_58 = *ppCVar2;
          }
        }
        pMVar1 = SimInfo::nextMolecule(this->info_,&local_50);
      }
      ConstraintWriter::writeConstraintForces
                (this->constraintWriter_,
                 (list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
                 &local_48);
      this->currConstraintTime_ = this->constraintTime_ + this->currConstraintTime_;
      std::__cxx11::_List_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
      ::_M_clear(&local_48);
    }
  }
  return;
}

Assistant:

void Shake::constraintF() {
    if (!doShake_) return;
    doConstraint(&Shake::constraintPairF);

    if (currentSnapshot_->getTime() >= currConstraintTime_) {
      Molecule* mol;
      SimInfo::MoleculeIterator mi;
      ConstraintPair* consPair;
      Molecule::ConstraintPairIterator cpi;
      std::list<ConstraintPair*> constraints;
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          constraints.push_back(consPair);
        }
      }

      constraintWriter_->writeConstraintForces(constraints);
      currConstraintTime_ += constraintTime_;
    }
  }